

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O1

void __thiscall QSslServerPrivate::checkClientHelloAndContinue(QSslServerPrivate *this)

{
  byte bVar1;
  long lVar2;
  QObject *pQVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  char cVar6;
  QSslSocket *this_00;
  long lVar7;
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *pDVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long in_FS_OFFSET;
  iterator iVar12;
  char byte;
  Connection local_50;
  Connection __old_val;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QObject **)&(this->super_QTcpServerPrivate).field_0x8;
  QObject::sender();
  this_00 = (QSslSocket *)QMetaObject::cast((QObject *)&QSslSocket::staticMetaObject);
  if (this_00 != (QSslSocket *)0x0) {
    lVar7 = (**(code **)(*(long *)&(this_00->super_QTcpSocket).super_QAbstractSocket + 0xa0))
                      (this_00);
    if (0 < lVar7) {
      byte = '\0';
      lVar7 = QIODevice::peek((char *)this_00,(longlong)&byte);
      if (lVar7 == 1) {
        __old_val.d_ptr = this_00;
        iVar12 = QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::
                 findImpl<unsigned_long_long>(&this->socketData,(unsigned_long_long *)&__old_val);
        uVar10 = iVar12.i.bucket;
        pDVar8 = iVar12.i.d;
        if (pDVar8 != (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>
                       *)0x0 || uVar10 != 0) {
          uVar9 = uVar10 >> 7;
          uVar11 = (uint)iVar12.i.bucket & 0x7f;
          if (*(long *)(pDVar8->spans[uVar9].entries[pDVar8->spans[uVar9].offsets[uVar11]].storage.
                        data + 8) != 0) {
            cVar6 = QMetaObject::Connection::isConnected_helper();
            if (cVar6 != '\0') {
              pEVar4 = pDVar8->spans[uVar9].entries;
              bVar1 = pDVar8->spans[uVar9].offsets[uVar11];
              QMetaObject::Connection::Connection(&local_50);
              __old_val.d_ptr = *(void **)(pEVar4[bVar1].storage.data + 8);
              pEVar5 = pEVar4 + bVar1;
              (pEVar5->storage).data[8] = '\0';
              (pEVar5->storage).data[9] = '\0';
              (pEVar5->storage).data[10] = '\0';
              (pEVar5->storage).data[0xb] = '\0';
              (pEVar5->storage).data[0xc] = '\0';
              (pEVar5->storage).data[0xd] = '\0';
              (pEVar5->storage).data[0xe] = '\0';
              (pEVar5->storage).data[0xf] = '\0';
              *(void **)(pEVar4[bVar1].storage.data + 8) = local_50.d_ptr;
              local_50.d_ptr = (QSslSocket *)0x0;
              QObject::disconnect(&__old_val);
              QMetaObject::Connection::~Connection(&__old_val);
              QMetaObject::Connection::~Connection(&local_50);
            }
          }
        }
        if (byte == '\x16') {
          if (pDVar8 != (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>
                         *)0x0 || uVar10 != 0) {
            QTimer::start();
          }
          QSslSocket::startServerEncryption(this_00);
          __old_val.d_ptr = (void *)0x0;
          local_50.d_ptr = this_00;
          QMetaObject::activate(pQVar3,&QSslServer::staticMetaObject,7,&__old_val.d_ptr);
          goto LAB_0016f94f;
        }
        (**(code **)(*(long *)&(this_00->super_QTcpSocket).super_QAbstractSocket + 0x100))(this_00);
      }
      QObject::deleteLater();
    }
  }
LAB_0016f94f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::checkClientHelloAndContinue()
{
    Q_Q(QSslServer);
    QSslSocket *socket = qobject_cast<QSslSocket *>(q->sender());
    if (Q_UNLIKELY(!socket) || socket->bytesAvailable() <= 0)
        return;

    char byte = '\0';
    if (socket->peek(&byte, 1) != 1) {
        socket->deleteLater();
        return;
    }

    auto it = socketData.find(quintptr(socket));
    const bool foundData = it != socketData.end();
    if (foundData && it->readyReadConnection)
        QObject::disconnect(std::exchange(it->readyReadConnection, {}));

    constexpr char CLIENT_HELLO = 0x16;
    if (byte != CLIENT_HELLO) {
        socket->disconnectFromHost();
        socket->deleteLater();
        return;
    }

    // Be nice and restart the timeout timer since some progress was made
    if (foundData)
        it->timeoutTimer->start();

    socket->startServerEncryption();
    Q_EMIT q->startedEncryptionHandshake(socket);
}